

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O3

int testSimpleNNShapeBad(void)

{
  pointer pcVar1;
  bool bVar2;
  ResultType RVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this;
  Type *this_00;
  LayerUnion this_01;
  WeightParams *this_02;
  ostream *poVar8;
  int iVar9;
  int iVar10;
  Result res;
  Model m1;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Model local_58;
  
  CoreML::Specification::Model::Model(&local_58);
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_58.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  iVar9 = (pAVar7->shape_).current_size_;
  if (iVar9 == (pAVar7->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar7->shape_,iVar9 + 1);
    iVar9 = (pAVar7->shape_).current_size_;
  }
  (pAVar7->shape_).current_size_ = iVar9 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar9] = 5;
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_58.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  iVar9 = (pAVar7->shape_).current_size_;
  if (iVar9 == (pAVar7->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar7->shape_,iVar9 + 1);
    iVar9 = (pAVar7->shape_).current_size_;
  }
  (pAVar7->shape_).current_size_ = iVar9 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar9] = 3;
  if (local_58._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_58);
    local_58._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_58.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_58.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  if (this_00->_oneof_case_[0] == 0x8c) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x8c;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_01.innerproduct_);
    (this_00->layer_).innerproduct_ = (InnerProductLayerParams *)this_01;
  }
  (this_01.innerproduct_)->inputchannels_ = 4;
  (this_01.innerproduct_)->outputchannels_ = 3;
  iVar9 = 0xc;
  do {
    this_02 = (WeightParams *)((this_01.activation_)->NonlinearityType_).relu_;
    if (this_02 == (WeightParams *)0x0) {
      this_02 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(this_02);
      ((this_01.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)this_02;
    }
    iVar10 = (this_02->floatvalue_).current_size_;
    if (iVar10 == (this_02->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&this_02->floatvalue_,iVar10 + 1);
      iVar10 = (this_02->floatvalue_).current_size_;
    }
    (this_02->floatvalue_).current_size_ = iVar10 + 1;
    ((this_02->floatvalue_).rep_)->elements[iVar10] = 1.0;
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  (this_01.innerproduct_)->hasbias_ = false;
  CoreML::validate<(MLModelType)500>((Result *)local_80,&local_58);
  bVar2 = CoreML::Result::good((Result *)local_80);
  if (bVar2) {
    RVar3 = CoreML::Result::type((Result *)local_80);
    iVar9 = 0;
    if (RVar3 == POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES) goto LAB_00154bfb;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"res.type() == ResultType::POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES",0x43);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x59);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  }
  std::ostream::put((char)poVar8);
  iVar9 = 1;
  std::ostream::flush();
LAB_00154bfb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_58);
  return iVar9;
}

Assistant:

int testSimpleNNShapeBad() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(3);

    auto *nn = m1.mutable_neuralnetwork();

    // The parameters of the layer don't match the network inputs & outputs
    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(4);
    innerProductParams->set_outputchannels(3);
    for (int i = 0; i < 12; i++) {
        innerProductParams->mutable_weights()->add_floatvalue(1.0);
    }

    innerProductParams->set_hasbias(false);

    // This is not valid from the perspective of the shapes in the network, but that is being raised as
    // a warning instead of being an invalid model.
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    ML_ASSERT(res.type() == ResultType::POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES);

    return 0;

}